

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

char * mm_typecode_to_str(char *matcode)

{
  char *pcVar1;
  char *pcStack_448;
  int error;
  char *types [4];
  char buffer [1025];
  char *matcode_local;
  
  if (*matcode == 'M') {
    pcStack_448 = "matrix";
  }
  if (matcode[1] == 'C') {
    types[0] = "coordinate";
  }
  else {
    if (matcode[1] != 'A') {
      return (char *)0x0;
    }
    types[0] = "array";
  }
  if (matcode[2] == 'R') {
    types[1] = "real";
  }
  else if (matcode[2] == 'C') {
    types[1] = "complex";
  }
  else if (matcode[2] == 'P') {
    types[1] = "pattern";
  }
  else {
    if (matcode[2] != 'I') {
      return (char *)0x0;
    }
    types[1] = "integer";
  }
  if (matcode[3] == 'G') {
    types[2] = "general";
  }
  else if (matcode[3] == 'S') {
    types[2] = "symmetric";
  }
  else if (matcode[3] == 'H') {
    types[2] = "hermitian";
  }
  else {
    if (matcode[3] != 'K') {
      return (char *)0x0;
    }
    types[2] = "skew-symmetric";
  }
  sprintf((char *)(types + 3),"%s %s %s %s",pcStack_448,types[0],types[1],types[2]);
  pcVar1 = mm_strdup((char *)(types + 3));
  return pcVar1;
}

Assistant:

char *mm_typecode_to_str(MM_typecode matcode) {
    char buffer[MM_MAX_LINE_LENGTH];
    char *types[4];
    char *mm_strdup(const char *);
    int error = 0;

    /* check for MTX type */
    if (mm_is_matrix(matcode))
        types[0] = MM_MTX_STR;
    else
        error = 1;

    /* check for CRD or ARR matrix */
    if (mm_is_sparse(matcode))
        types[1] = MM_SPARSE_STR;
    else if (mm_is_dense(matcode))
        types[1] = MM_DENSE_STR;
    else
        return NULL;

    /* check for element data type */
    if (mm_is_real(matcode))
        types[2] = MM_REAL_STR;
    else if (mm_is_complex(matcode))
        types[2] = MM_COMPLEX_STR;
    else if (mm_is_pattern(matcode))
        types[2] = MM_PATTERN_STR;
    else if (mm_is_integer(matcode))
        types[2] = MM_INT_STR;
    else
        return NULL;


    /* check for symmetry type */
    if (mm_is_general(matcode))
        types[3] = MM_GENERAL_STR;
    else if (mm_is_symmetric(matcode))
        types[3] = MM_SYMM_STR;
    else if (mm_is_hermitian(matcode))
        types[3] = MM_HERM_STR;
    else if (mm_is_skew(matcode))
        types[3] = MM_SKEW_STR;
    else
        return NULL;

    sprintf(buffer, "%s %s %s %s", types[0], types[1], types[2], types[3]);
    return mm_strdup(buffer);

}